

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesAlbum.cpp
# Opt level: O3

void __thiscall ResourcesAlbum::clear(ResourcesAlbum *this)

{
  pointer prVar1;
  _Rb_tree_node_base *p_Var2;
  
  clearLeafsContent(this);
  for (p_Var2 = (this->leafToContentWrapper)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->leafToContentWrapper)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if (p_Var2[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var2[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<ResourceLeafWrapper_*,_std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>,_std::_Select1st<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>,_std::less<ResourceLeafWrapper_*>,_std::allocator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>_>
  ::clear(&(this->leafToContentWrapper)._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_std::vector<ResourceLeafWrapper_*,_std::allocator<ResourceLeafWrapper_*>_>_>,_std::_Select1st<std::pair<const_long,_std::vector<ResourceLeafWrapper_*,_std::allocator<ResourceLeafWrapper_*>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<ResourceLeafWrapper_*,_std::allocator<ResourceLeafWrapper_*>_>_>_>_>
  ::clear(&(this->allLeafs)._M_t);
  prVar1 = (this->allTypes).
           super__Vector_base<pe::resource_type,_std::allocator<pe::resource_type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->allTypes).super__Vector_base<pe::resource_type,_std::allocator<pe::resource_type>_>.
      _M_impl.super__Vector_impl_data._M_finish != prVar1) {
    (this->allTypes).super__Vector_base<pe::resource_type,_std::allocator<pe::resource_type>_>.
    _M_impl.super__Vector_impl_data._M_finish = prVar1;
  }
  return;
}

Assistant:

void ResourcesAlbum::clear()
{
    clearLeafsContent();
    //---
    std::map<ResourceLeafWrapper*, ResourceContentWrapper*>::iterator cntItr;
    for (cntItr = leafToContentWrapper.begin(); cntItr != leafToContentWrapper.end(); ++cntItr) {
        ResourceContentWrapper* cntWr = cntItr->second;
        delete cntWr;
    }
    leafToContentWrapper.clear();
    //---
    allLeafs.clear();
    allTypes.clear();
}